

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

int Potassco::xconvert(char *x,uint *out,char **errPos,int param_4)

{
  bool bVar1;
  unsigned_long_long temp;
  char *x_local;
  
  temp = 0;
  x_local = x;
  bVar1 = parseUnsigned(&x_local,&temp,0xffffffff);
  if (bVar1) {
    *out = (uint)temp;
  }
  if (errPos != (char **)0x0) {
    *errPos = x_local;
  }
  return (uint)bVar1;
}

Assistant:

int xconvert(const char* x, unsigned& out, const char** errPos, int) {
	unsigned long long temp = 0;
	if (parseUnsigned(x, temp, UINT_MAX)) {
		out = static_cast<unsigned>(temp);
		return parsed(1, x, errPos);
	}
	return parsed(0, x, errPos);
}